

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

void __thiscall Ptex::v2_4::PtexReader::~PtexReader(PtexReader *this)

{
  pointer plVar1;
  bool bVar2;
  reference ppLVar3;
  Level *in_RDI;
  iterator i;
  Level *in_stack_ffffffffffffffc8;
  PtexReader *in_stack_ffffffffffffffd0;
  __normal_iterator<Ptex::v2_4::PtexReader::Level_**,_std::vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>_>
  local_10 [2];
  
  *(undefined ***)&((_Vector_base<char,_std::allocator<char>_> *)&in_RDI->fdh)->_M_impl =
       &PTR__PtexReader_0395e870;
  closeFP(in_stack_ffffffffffffffd0);
  if ((in_RDI[4].offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_start != (pointer)0x0) &&
     (plVar1 = in_RDI[4].offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start, plVar1 != (pointer)0x0)) {
    operator_delete__(plVar1);
  }
  if ((in_RDI[4].offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_finish != (pointer)0x0) &&
     (in_stack_ffffffffffffffd0 =
           (PtexReader *)
           in_RDI[4].offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish, in_stack_ffffffffffffffd0 != (PtexReader *)0x0)) {
    (*(in_stack_ffffffffffffffd0->super_PtexTexture)._vptr_PtexTexture[1])();
  }
  local_10[0]._M_current =
       (Level **)
       std::
       vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>::
       begin((vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>
              *)in_stack_ffffffffffffffc8);
  while( true ) {
    std::vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>::
    end((vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_> *
        )in_stack_ffffffffffffffc8);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<Ptex::v2_4::PtexReader::Level_**,_std::vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<Ptex::v2_4::PtexReader::Level_**,_std::vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar2) break;
    ppLVar3 = __gnu_cxx::
              __normal_iterator<Ptex::v2_4::PtexReader::Level_**,_std::vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>_>
              ::operator*(local_10);
    if (*ppLVar3 != (Level *)0x0) {
      ppLVar3 = __gnu_cxx::
                __normal_iterator<Ptex::v2_4::PtexReader::Level_**,_std::vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>_>
                ::operator*(local_10);
      in_stack_ffffffffffffffc8 = *ppLVar3;
      if (in_stack_ffffffffffffffc8 != (Level *)0x0) {
        Level::~Level(in_RDI);
        operator_delete(in_stack_ffffffffffffffc8,0x48);
      }
    }
    __gnu_cxx::
    __normal_iterator<Ptex::v2_4::PtexReader::Level_**,_std::vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>_>
    ::operator++(local_10);
  }
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)in_RDI);
  PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>::
  ~PtexHashMap((PtexHashMap<Ptex::v2_4::PtexReader::ReductionKey,_Ptex::v2_4::PtexReader::FaceData_*>
                *)in_stack_ffffffffffffffd0);
  std::vector<Ptex::v2_4::PtexReader::FaceEdit,_std::allocator<Ptex::v2_4::PtexReader::FaceEdit>_>::
  ~vector((vector<Ptex::v2_4::PtexReader::FaceEdit,_std::allocator<Ptex::v2_4::PtexReader::FaceEdit>_>
           *)in_RDI);
  std::vector<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>::
  ~vector((vector<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>
           *)in_RDI);
  std::vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>::
  ~vector((vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>
           *)in_RDI);
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)in_RDI);
  std::vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_>::~vector
            ((vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_> *)in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI);
  std::vector<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>::~vector
            ((vector<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_> *)in_RDI);
  std::__cxx11::string::~string
            ((string *)
             &in_RDI[1].offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish);
  DefaultInputHandler::~DefaultInputHandler((DefaultInputHandler *)0xbb99dd);
  Mutex::~Mutex((Mutex *)0xbb99eb);
  PtexTexture::~PtexTexture((PtexTexture *)in_RDI);
  return;
}

Assistant:

PtexReader::~PtexReader()
{
    closeFP();
    if (_constdata) delete [] _constdata;
    if (_metadata) delete _metadata;

    for (std::vector<Level*>::iterator i = _levels.begin(); i != _levels.end(); ++i) {
        if (*i) delete *i;
    }
}